

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateLdFldWithCachedType
          (Lowerer *this,Instr *instrLdFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  uint uVar1;
  uint uVar2;
  InlineCacheIndex IVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint16 uVar9;
  uint uVar10;
  uint functionId;
  BailOutKind BVar11;
  undefined4 *puVar12;
  Opnd *pOVar13;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  char16 *pcVar15;
  PropertySym *pPVar16;
  JITTimeFunctionBody *this_02;
  char16 *pcVar17;
  char16 *pcVar18;
  char16_t *pcVar19;
  RegOpnd *pRVar20;
  MemRefOpnd *this_03;
  intptr_t iVar21;
  LabelInstr *branchTarget;
  BranchInstr *instr_00;
  BailOutInfo *pBVar22;
  LabelInstr *local_d0;
  bool local_ba;
  bool local_b9;
  Opnd *pOStack_78;
  uint16 index;
  Opnd *opndSlotArray;
  bool emitTypeCheck;
  bool emitLoadFromProtoTypeCheck;
  bool emitLocalTypeCheck;
  bool emitPrimaryTypeCheck;
  bool hasTypeCheckBailout;
  PropertySymOpnd *propertySymOpnd;
  LabelInstr *labelDone;
  LabelInstr *labelTypeCheckFailed;
  LabelInstr *labelObjCheckFailed;
  Opnd *opnd;
  Instr *instr;
  RegOpnd **typeOpndOut_local;
  LabelInstr **labelHelperOut_local;
  bool *continueAsHelperOut_local;
  Instr *instrLdFld_local;
  Lowerer *this_local;
  
  labelTypeCheckFailed = (LabelInstr *)0x0;
  labelDone = (LabelInstr *)0x0;
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17bd,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c0,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c3,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  pOVar13 = IR::Instr::GetSrc1(instrLdFld);
  bVar5 = IR::Opnd::IsSymOpnd(pOVar13);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c6,"(instrLdFld->GetSrc1()->IsSymOpnd())",
                       "instrLdFld->GetSrc1()->IsSymOpnd()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  pOVar13 = IR::Instr::GetSrc1(instrLdFld);
  this_00 = IR::Opnd::AsSymOpnd(pOVar13);
  bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar5) {
    return false;
  }
  pOVar13 = IR::Instr::GetSrc1(instrLdFld);
  this_01 = IR::Opnd::AsPropertySymOpnd(pOVar13);
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (!bVar5) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(this_01);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d2,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(this_01);
  if ((!bVar5) && (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01), !bVar5)) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(this_01);
  if (bVar5) {
    bVar5 = IR::Instr::HasBailOutInfo(instrLdFld);
    if (bVar5) {
      BVar11 = IR::Instr::GetBailOutKind(instrLdFld);
      bVar5 = IR::IsTypeCheckBailOutKind(BVar11);
      if (bVar5) goto LAB_007bd97c;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d9,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind()))"
                      );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
LAB_007bd97c:
  bVar5 = IR::PropertySymOpnd::IsTypeCheckProtected(this_01);
  if ((bVar5) &&
     (pBVar14 = IR::PropertySymOpnd::GetGuardedPropOps(this_01),
     pBVar14 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17dd,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  uVar10 = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ObjTypeSpecPhase,uVar10,functionId);
  if (bVar5) {
    pcVar15 = Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode);
    pPVar16 = Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
    uVar1 = pPVar16->m_propertyId;
    this_02 = Func::GetJITFunctionBody(this->m_func);
    pcVar17 = JITTimeFunctionBody::GetDisplayName(this_02);
    uVar2 = this_01->m_inlineCacheIndex;
    pcVar18 = IR::PropertySymOpnd::GetCacheLayoutString(this_01);
    bVar5 = IR::PropertySymOpnd::IsTypeChecked(this_01);
    pcVar19 = L"false";
    if (bVar5) {
      pcVar19 = L"true";
    }
    Output::Print(L"Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar15,(ulong)uVar1,pcVar17,(ulong)uVar2,pcVar18,pcVar19);
    Output::Flush();
  }
  bVar5 = IR::PropertySymOpnd::HasFinalType(this_01);
  if ((bVar5) && (bVar5 = IR::PropertySymOpnd::IsLoadedFromProto(this_01), !bVar5)) {
    IR::PropertySymOpnd::UpdateSlotForFinalType(this_01);
  }
  bVar5 = IR::Instr::HasBailOutInfo(instrLdFld);
  local_b9 = false;
  if (bVar5) {
    BVar11 = IR::Instr::GetBailOutKind(instrLdFld);
    local_b9 = IR::IsTypeCheckBailOutKind(BVar11);
  }
  bVar5 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar6 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01);
  bVar7 = IR::PropertySymOpnd::NeedsLoadFromProtoTypeCheck(this_01);
  local_ba = true;
  if ((!bVar5) && (local_ba = true, !bVar6)) {
    local_ba = bVar7;
  }
  if (local_ba != false) {
    if (bVar7) {
      IR::PropertySymOpnd::EnsureGuardedPropOps(this_01,this->m_func->m_alloc);
      uVar10 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
      IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar10);
    }
    labelDone = IR::LabelInstr::New(Label,this->m_func,true);
    local_d0 = labelDone;
    if (local_b9 == false) {
      local_d0 = IR::LabelInstr::New(Label,this->m_func,true);
    }
    labelTypeCheckFailed = local_d0;
    pRVar20 = GenerateCachedTypeCheck(this,instrLdFld,this_01,local_d0,labelDone,(LabelInstr *)0x0);
    *typeOpndOut = pRVar20;
  }
  bVar8 = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
  if (bVar8) {
    pOStack_78 = LoadSlotArrayWithCachedProtoType(this,instrLdFld,this_01);
  }
  else {
    pOStack_78 = LoadSlotArrayWithCachedLocalType(this,instrLdFld,this_01);
  }
  uVar9 = IR::PropertySymOpnd::GetSlotIndex(this_01);
  if (uVar9 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1815,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar8) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar8 = IR::Opnd::IsRegOpnd(pOStack_78);
  if (bVar8) {
    pRVar20 = IR::Opnd::AsRegOpnd(pOStack_78);
    labelObjCheckFailed =
         (LabelInstr *)IR::IndirOpnd::New(pRVar20,(uint)uVar9 << 3,TyInt64,this->m_func,false);
  }
  else {
    bVar8 = IR::Opnd::IsMemRefOpnd(pOStack_78);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x181d,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()");
      if (!bVar8) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    this_03 = IR::Opnd::AsMemRefOpnd(pOStack_78);
    iVar21 = IR::MemRefOpnd::GetMemLoc(this_03);
    labelObjCheckFailed =
         (LabelInstr *)
         IR::MemRefOpnd::New((void *)(iVar21 + (ulong)uVar9 * 8),TyInt64,this->m_func,
                             AddrOpndKindDynamicPropertySlotRef);
  }
  pOVar13 = IR::Instr::GetDst(instrLdFld);
  InsertMove(pOVar13,(Opnd *)labelObjCheckFailed,instrLdFld,true);
  if (((bVar5) || (bVar6)) || (bVar7)) {
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    instr_00 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLdFld,&instr_00->super_Instr);
    IR::Instr::InsertBefore(instrLdFld,&labelDone->super_Instr);
    IR::Instr::InsertAfter(instrLdFld,&branchTarget->super_Instr);
    if (local_b9 == false) {
      *continueAsHelperOut = true;
      if ((labelTypeCheckFailed == (LabelInstr *)0x0) || (labelTypeCheckFailed == labelDone)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x184b,
                           "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed)"
                           ,
                           "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed"
                          );
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      *labelHelperOut = labelTypeCheckFailed;
      this_local._7_1_ = false;
    }
    else {
      bVar5 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eb5b30,ObjTypeSpecIsolatedFldOpsWithBailOutPhase);
      if ((!bVar5) && (bVar5 = IR::PropertySymOpnd::IsTypeDead(this_01), bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1838,
                           "(Js::Configuration::Global.flags.On.IsEnabled((Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase)) || !propertySymOpnd->IsTypeDead())"
                           ,"Why does a field load have a type check bailout, if its type is dead?")
        ;
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pBVar22 = IR::Instr::GetBailOutInfo(instrLdFld);
      if (pBVar22->bailOutInstr != instrLdFld) {
        IVar3 = this_01->m_inlineCacheIndex;
        pBVar22 = IR::Instr::GetBailOutInfo(instrLdFld);
        pBVar22->polymorphicCacheIndex = IVar3;
      }
      IR::Instr::FreeDst(instrLdFld);
      IR::Instr::FreeSrc1(instrLdFld);
      instrLdFld->m_opcode = BailOut;
      GenerateBailOut(this,instrLdFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      this_local._7_1_ = true;
    }
  }
  else {
    if (labelDone != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1826,"(labelTypeCheckFailed == nullptr)",
                         "labelTypeCheckFailed == nullptr");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    bVar5 = IR::Instr::HasBailOutInfo(instrLdFld);
    if ((bVar5) && (bVar5 = IR::Instr::HasLazyBailOut(instrLdFld), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1827,"(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut())",
                         "Why does a direct field load have bailout that is not lazy?");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    IR::Instr::Remove(instrLdFld);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::GenerateLdFldWithCachedType(IR::Instr * instrLdFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::Opnd *opnd;
    IR::LabelInstr *labelObjCheckFailed = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrLdFld->GetSrc1()->IsSymOpnd());
    if (!instrLdFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrLdFld->GetSrc1()->AsPropertySymOpnd();
    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex,
        propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind());

    // If the hard-coded type is not available here, do a type check, and branch to the helper if the check fails.
    // In the prototype case, we have to check the type even if it was checked upstream, to cover the case where
    // the property has been added locally. Note that this is not necessary if the proto chain has been checked,
    // because then we know there's been no store of the property since the type was checked.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    bool emitLocalTypeCheck = propertySymOpnd->NeedsLocalTypeCheck();
    bool emitLoadFromProtoTypeCheck = propertySymOpnd->NeedsLoadFromProtoTypeCheck();
    bool emitTypeCheck = emitPrimaryTypeCheck || emitLocalTypeCheck || emitLoadFromProtoTypeCheck;

    if (emitTypeCheck)
    {
        if (emitLoadFromProtoTypeCheck)
        {
            propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
            propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
        }
        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelTypeCheckFailed : IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        *typeOpndOut = this->GenerateCachedTypeCheck(instrLdFld, propertySymOpnd, labelObjCheckFailed, labelTypeCheckFailed);
    }

    IR::Opnd *opndSlotArray;
    if (propertySymOpnd->IsLoadedFromProto())
    {
        opndSlotArray = this->LoadSlotArrayWithCachedProtoType(instrLdFld, propertySymOpnd);
    }
    else
    {
        opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrLdFld, propertySymOpnd);
    }

    // Load the value from the slot, getting the slot ID from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, this->m_func);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, this->m_func, IR::AddrOpndKindDynamicPropertySlotRef);
    }
    Lowerer::InsertMove(instrLdFld->GetDst(), opnd, instrLdFld);

    // We eliminate the helper, or the type check succeeds, or we bail out before the operation.
    // Either delete the original instruction or replace it with a bailout.
    if (!emitPrimaryTypeCheck && !emitLocalTypeCheck && !emitLoadFromProtoTypeCheck)
    {
        Assert(labelTypeCheckFailed == nullptr);
        AssertMsg(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut(), "Why does a direct field load have bailout that is not lazy?");
        instrLdFld->Remove();
        return true;
    }

    // Otherwise, branch around the bailout or helper.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrLdFld->InsertBefore(instr);

    // Insert the bailout or helper label here.
    instrLdFld->InsertBefore(labelTypeCheckFailed);
    instrLdFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        AssertMsg(PHASE_ON1(Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase) || !propertySymOpnd->IsTypeDead(),
            "Why does a field load have a type check bailout, if its type is dead?");

        // Convert the original instruction to a bailout.
        if (instrLdFld->GetBailOutInfo()->bailOutInstr != instrLdFld)
        {
            // Set the cache index in the bailout info so that the bailout code will write it into the
            // bailout record at runtime.
            instrLdFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        instrLdFld->FreeDst();
        instrLdFld->FreeSrc1();
        instrLdFld->m_opcode = Js::OpCode::BailOut;
        this->GenerateBailOut(instrLdFld);

        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}